

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers_p.h
# Opt level: O0

void QtPromisePrivate::connectDestroyedToReject<int,Object>
               (QPromiseConnections *connections,QPromiseReject<void> *reject,Object *sender)

{
  QPromiseConnections local_40;
  QPromiseReject<int> local_30 [8];
  Connection local_28;
  Object *local_20;
  Object *sender_local;
  QPromiseReject<void> *reject_local;
  QPromiseConnections *connections_local;
  
  local_20 = sender;
  sender_local = (Object *)reject;
  reject_local = (QPromiseReject<void> *)connections;
  QtPromise::QPromiseConnections::QPromiseConnections(&local_40,connections);
  QtPromise::QPromiseReject<int>::QPromiseReject(local_30,(QPromiseReject<void> *)sender_local);
  QObject::
  connect<void(QObject::*)(QObject*),QtPromisePrivate::connectDestroyedToReject<int,Object>(QtPromise::QPromiseConnections_const&,QtPromise::QPromiseReject<int>const&,Object_const*)::_lambda()_1_>
            ((Object *)&local_28,(offset_in_QObject_to_subr)sender,
             (anon_class_24_2_90de82aa_for_function *)QObject::destroyed);
  QtPromise::QPromiseConnections::operator<<(connections,&local_28);
  QMetaObject::Connection::~Connection(&local_28);
  connectDestroyedToReject<int,Object>(QtPromise::QPromiseConnections_const&,QtPromise::QPromiseReject<int>const&,Object_const*)
  ::{lambda()#1}::~QPromiseReject((_lambda___1_ *)&local_40);
  return;
}

Assistant:

void connectDestroyedToReject(const QtPromise::QPromiseConnections& connections,
                              const QtPromise::QPromiseReject<T>& reject,
                              const Sender* sender)
{
    connections << QObject::connect(sender, &QObject::destroyed, [=]() {
        connections.disconnect();
        reject(QtPromise::QPromiseContextException{});
    });
}